

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.h
# Opt level: O0

void __thiscall CS248::Matrix4x4::Matrix4x4(Matrix4x4 *this,double *data)

{
  double *pdVar1;
  long in_RSI;
  Vector4D *in_RDI;
  int j;
  int i;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Matrix4x4 *this_00;
  Vector4D *local_20;
  int local_18;
  int local_14;
  
  local_20 = in_RDI;
  do {
    Vector4D::Vector4D(local_20);
    local_20 = local_20 + 1;
  } while (local_20 != in_RDI + 4);
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      this_00 = *(Matrix4x4 **)(in_RSI + (long)(local_14 * 4 + local_18) * 8);
      pdVar1 = operator()(this_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      *pdVar1 = (double)this_00;
    }
  }
  return;
}

Assistant:

Matrix4x4(double * data)
  {
    for( int i = 0; i < 4; i++ )
    for( int j = 0; j < 4; j++ )
    {
      // Transpostion happens within the () query.
      (*this)(i,j) = data[i*4 + j];
    }

  }